

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O1

void do_quaff(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CClass *pCVar2;
  OBJ_DATA *obj;
  int nTimer;
  char *txt;
  CHAR_DATA *ch_local;
  string local_12a8;
  string local_1288;
  string local_1268;
  string local_1248;
  char arg [4608];
  
  ch_local = ch;
  one_argument(argument,arg);
  bVar1 = is_npc(ch_local);
  if (bVar1) {
LAB_0026449c:
    nTimer = 2;
  }
  else {
    pCVar2 = ch_local->my_class;
    if ((pCVar2 == (CClass *)0x0) &&
       ((ch_local->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar2 = ch_local->pIndexData->my_class, pCVar2 == (CClass *)0x0)))) {
      pCVar2 = CClass::GetClass(0);
    }
    bVar1 = RString::operator==(&pCVar2->name,"necromancer");
    nTimer = 1;
    if (!bVar1) {
      pCVar2 = ch_local->my_class;
      if ((pCVar2 == (CClass *)0x0) &&
         ((ch_local->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar2 = ch_local->pIndexData->my_class, pCVar2 == (CClass *)0x0)))) {
        pCVar2 = CClass::GetClass(0);
      }
      bVar1 = RString::operator==(&pCVar2->name,"sorcerer");
      if (!bVar1) {
        pCVar2 = ch_local->my_class;
        if ((pCVar2 == (CClass *)0x0) &&
           ((ch_local->pIndexData == (MOB_INDEX_DATA *)0x0 ||
            (pCVar2 = ch_local->pIndexData->my_class, pCVar2 == (CClass *)0x0)))) {
          pCVar2 = CClass::GetClass(0);
        }
        bVar1 = RString::operator==(&pCVar2->name,"anti-paladin");
        if (!bVar1) goto LAB_0026449c;
      }
    }
  }
  if (arg[0] == '\0') {
    obj = get_eq_char(ch_local,0x11);
    if ((obj != (OBJ_DATA *)0x0) && (obj->item_type == 10)) {
      act("$n quaffs $p in one large gulp.",ch_local,obj,(void *)0x0,0);
      act("You quaff the contents of $p in one large gulp.",ch_local,obj,(void *)0x0,3);
      bVar1 = check_deny_magic(ch_local);
      if (!bVar1) {
        local_1248._M_dataplus._M_p = (pointer)&local_1248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1248,"do_quaff","");
        local_1288._M_dataplus._M_p = (pointer)&local_1288.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1288,"quaff_potion","");
        CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                  (&RS.Queue,nTimer,&local_1248,&local_1288,quaff_potion,&ch_local,obj->value,
                   obj->value + 1,obj->value + 2,obj->value + 3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
          operator_delete(local_1288._M_dataplus._M_p,local_1288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
          operator_delete(local_1248._M_dataplus._M_p,local_1248.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0026484d:
      extract_obj(obj);
      return;
    }
    txt = "Quaff what?\n\r";
  }
  else {
    obj = get_obj_carry(ch_local,arg,ch_local);
    if (obj == (OBJ_DATA *)0x0) {
      txt = "You do not have that potion.\n\r";
    }
    else if (obj->item_type == 10) {
      if (ch_local->fighting == (CHAR_DATA *)0x0) {
        act("$n quaffs $p in one large gulp.",ch_local,obj,(void *)0x0,0);
        act("You quaff the contents of $p in one large gulp.",ch_local,obj,(void *)0x0,3);
        bVar1 = check_deny_magic(ch_local);
        if (!bVar1) {
          local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1268,"do_quaff","");
          local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_12a8,"quaff_potion","");
          CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                    (&RS.Queue,nTimer,&local_1268,&local_12a8,quaff_potion,&ch_local,obj->value,
                     obj->value + 1,obj->value + 2,obj->value + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
            operator_delete(local_12a8._M_dataplus._M_p,local_12a8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
            operator_delete(local_1268._M_dataplus._M_p,local_1268.field_2._M_allocated_capacity + 1
                           );
          }
        }
        goto LAB_0026484d;
      }
      txt = "You\'re too busy fighting to quaff.\n\r";
    }
    else {
      txt = "You can quaff only potions.\n\r";
    }
  }
  send_to_char(txt,ch_local);
  return;
}

Assistant:

void do_quaff(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int nDelay = 0;

	one_argument(argument, arg);

	if (!is_npc(ch)
		&& (ch->Class()->name == "necromancer" || ch->Class()->name == "sorcerer" || ch->Class()->name == "anti-paladin"))
	{
		nDelay = 1;
	}
	else
	{
		nDelay = 2;
	}

	/* Can quaff held potions, even in combat! -- Eladrian */

	if (arg[0] == '\0')
	{
		obj = get_eq_char(ch, WEAR_HOLD);

		if (obj != nullptr)
		{
			if (obj->item_type == ITEM_POTION)
			{
				act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
				act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);
	
				if (!check_deny_magic(ch))
				{
					RS.Queue.AddToQueue(nDelay,
						"do_quaff",
						"quaff_potion",
						quaff_potion,
						ch,
						obj->value[0],
						obj->value[1],
						obj->value[2],
						obj->value[3]);
				}

				extract_obj(obj);
				return;
			}
		}

		send_to_char("Quaff what?\n\r", ch);
		return;
	}

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		send_to_char("You do not have that potion.\n\r", ch);
		return;
	}

	if (obj->item_type != ITEM_POTION)
	{
		send_to_char("You can quaff only potions.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to quaff.\n\r", ch);
		return;
	}

	act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
	act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);

	if (!check_deny_magic(ch))
	{
		RS.Queue.AddToQueue(nDelay,
			"do_quaff",
			"quaff_potion",
			quaff_potion,
			ch,
			obj->value[0],
			obj->value[1],
			obj->value[2],
			obj->value[3]);
	}

	extract_obj(obj);
}